

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::genVertexArrays(ReferenceContext *this,int numArrays,deUint32 *vertexArrays)

{
  deBool dVar1;
  deUint32 dVar2;
  int local_24;
  int ndx;
  deUint32 *vertexArrays_local;
  int numArrays_local;
  ReferenceContext *this_local;
  
  do {
    if (vertexArrays == (deUint32 *)0x0) {
      setError(this,0x501);
      return;
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  for (local_24 = 0; local_24 < numArrays; local_24 = local_24 + 1) {
    dVar2 = rc::ObjectManager<sglr::rc::VertexArray>::allocateName(&this->m_vertexArrays);
    vertexArrays[local_24] = dVar2;
  }
  return;
}

Assistant:

void ReferenceContext::genVertexArrays (int numArrays, deUint32* vertexArrays)
{
	RC_IF_ERROR(!vertexArrays, GL_INVALID_VALUE, RC_RET_VOID);

	for (int ndx = 0; ndx < numArrays; ndx++)
		vertexArrays[ndx] = m_vertexArrays.allocateName();
}